

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_cte.cpp
# Opt level: O2

void __thiscall
duckdb::CTELocalState::CTELocalState(CTELocalState *this,ClientContext *context,PhysicalCTE *op)

{
  vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_> *pvVar1;
  vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_> *pvVar2;
  ColumnDataCollection *pCVar3;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> vStack_38;
  
  *(undefined4 *)&(this->super_LocalSinkState).partition_info.batch_index.index = 0xffffffff;
  *(undefined4 *)((long)&(this->super_LocalSinkState).partition_info.batch_index.index + 4) =
       0xffffffff;
  *(undefined4 *)&(this->super_LocalSinkState).partition_info.min_batch_index.index = 0xffffffff;
  *(undefined4 *)((long)&(this->super_LocalSinkState).partition_info.min_batch_index.index + 4) =
       0xffffffff;
  pvVar1 = &(this->super_LocalSinkState).partition_info.partition_data.
            super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>;
  (pvVar1->
  super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar1->
  super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   ((long)&(this->super_LocalSinkState).partition_info.partition_data.
           super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
           super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
           ._M_impl.super__Vector_impl_data + 0x10) = (undefined1  [16])0x0;
  (this->super_LocalSinkState)._vptr_LocalSinkState = (_func_int **)&PTR__CTELocalState_027c00a8;
  pCVar3 = shared_ptr<duckdb::ColumnDataCollection,_true>::operator->(&op->working_table);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&vStack_38,
             &(pCVar3->types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  ColumnDataCollection::ColumnDataCollection
            (&this->lhs_data,context,(vector<duckdb::LogicalType,_true> *)&vStack_38,
             BUFFER_MANAGER_ALLOCATOR);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&vStack_38);
  (this->append_state).current_chunk_state.handles._M_h._M_buckets =
       &(this->append_state).current_chunk_state.handles._M_h._M_single_bucket;
  (this->append_state).current_chunk_state.handles._M_h._M_bucket_count = 1;
  (this->append_state).current_chunk_state.handles._M_h._M_before_begin = (_Hash_node_base *)0x0;
  (this->append_state).current_chunk_state.handles._M_h._M_element_count = 0;
  (this->append_state).current_chunk_state.handles._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined1 (*) [16])
   &(this->append_state).current_chunk_state.handles._M_h._M_rehash_policy._M_next_resize =
       (undefined1  [16])0x0;
  (this->append_state).current_chunk_state.properties = INVALID;
  pvVar2 = &(this->append_state).vector_data.
            super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>;
  (pvVar2->
  super__Vector_base<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar2->
  super__Vector_base<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->append_state).vector_data.
  super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
  super__Vector_base<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ColumnDataCollection::InitializeAppend(&this->lhs_data,&this->append_state);
  return;
}

Assistant:

explicit CTELocalState(ClientContext &context, const PhysicalCTE &op)
	    : lhs_data(context, op.working_table->Types()) {
		lhs_data.InitializeAppend(append_state);
	}